

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall
CMU462::Camera::configure(Camera *this,CameraInfo *info,size_t screenW,size_t screenH)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double ar1;
  size_t screenH_local;
  size_t screenW_local;
  CameraInfo *info_local;
  Camera *this_local;
  undefined4 uVar6;
  
  this->screenW = screenW;
  this->screenH = screenH;
  this->nClip = (double)info->nClip;
  this->fClip = (double)info->fClip;
  this->hFov = (double)info->hFov;
  this->vFov = (double)info->vFov;
  dVar1 = radians<double>(this->hFov);
  dVar2 = tan(dVar1 * 0.5);
  dVar1 = radians<double>(this->vFov);
  dVar1 = tan(dVar1 * 0.5);
  dVar2 = dVar2 / dVar1;
  auVar3._8_4_ = (int)(screenW >> 0x20);
  auVar3._0_8_ = screenW;
  auVar3._12_4_ = 0x45300000;
  uVar6 = (undefined4)(screenH >> 0x20);
  auVar5._8_4_ = uVar6;
  auVar5._0_8_ = screenH;
  auVar5._12_4_ = 0x45300000;
  this->ar = ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)screenW) - 4503599627370496.0)) /
             ((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)screenH) - 4503599627370496.0));
  if (this->ar <= dVar2) {
    if (this->ar <= dVar2 && dVar2 != this->ar) {
      dVar1 = radians<double>(this->hFov);
      dVar1 = tan(dVar1 / 2.0);
      dVar1 = atan(dVar1 / this->ar);
      dVar1 = degrees<double>(dVar1);
      this->vFov = dVar1 * 2.0;
    }
  }
  else {
    dVar1 = radians<double>(this->vFov);
    dVar1 = tan(dVar1 / 2.0);
    dVar1 = atan(dVar1 * this->ar);
    dVar1 = degrees<double>(dVar1);
    this->hFov = dVar1 * 2.0;
  }
  auVar4._8_4_ = uVar6;
  auVar4._0_8_ = screenH;
  auVar4._12_4_ = 0x45300000;
  dVar1 = radians<double>(this->vFov);
  dVar1 = tan(dVar1 / 2.0);
  this->screenDist =
       ((auVar4._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)screenH) - 4503599627370496.0)) / (dVar1 * 2.0);
  return;
}

Assistant:

void Camera::configure(const CameraInfo& info, size_t screenW, size_t screenH) {
    this->screenW = screenW;
    this->screenH = screenH;
    nClip = info.nClip;
    fClip = info.fClip;
    hFov = info.hFov;
    vFov = info.vFov;

    double ar1 = tan(radians(hFov) / 2) / tan(radians(vFov) / 2);
    ar = static_cast<double>(screenW) / screenH;
    if (ar1 < ar) {
      // hFov is too small
      hFov = 2 * degrees(atan(tan(radians(vFov) / 2) * ar));
    } else if (ar1 > ar) {
      // vFov is too small
      vFov = 2 * degrees(atan(tan(radians(hFov) / 2) / ar));
    }
    screenDist = ((double) screenH) / (2.0 * tan(radians(vFov) / 2));
  }